

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_7::ReplaceMbcnt
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  TypeManager *this;
  DefUseManager *this_00;
  byte bVar1;
  Analysis AVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t id;
  uint32_t uVar5;
  int iVar6;
  Instruction *pIVar7;
  Type *pTVar8;
  Instruction *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  uint32_t vec1;
  InstructionBuilder ir_builder;
  Vector temp_type;
  InstructionBuilder local_f8;
  undefined1 local_d8 [16];
  pointer local_c8;
  uint local_c0 [2];
  uint *local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  undefined1 local_a8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_88;
  Vector local_80;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  AVar2 = context->valid_analyses_;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(context);
    AVar2 = context->valid_analyses_;
  }
  this = (context->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(context);
  }
  this_00 = (context->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar3 = IRContext::GetBuiltinInputVarId(context,0x1144);
  if (uVar3 == 0) {
    __assert_fail("var_id != 0 && \"Could not get SubgroupLtMask variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1e8,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  IRContext::AddCapability(context,GroupNonUniformBallot);
  pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar3);
  uVar4 = 0;
  if (pIVar7->has_type_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar7,0);
  }
  pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar4);
  uVar9 = (pIVar7->has_result_id_ & 1) + 1;
  if (pIVar7->has_type_id_ == false) {
    uVar9 = (uint)pIVar7->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(pIVar7,uVar9 + 1);
  pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar4);
  if (pIVar7->opcode_ != OpTypeVector) {
    __assert_fail("var_type->opcode() == spv::Op::OpTypeVector && \"Variable is suppose to be a vector of 4 ints\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1ef,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  local_80.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.super_Type.kind_ = kInteger;
  local_80.super_Type._36_4_ = 0x20;
  local_80.super_Type._vptr_Type = (_func_int **)&PTR__Type_003db8d0;
  local_80.element_type_._0_1_ = 0;
  if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(context);
  }
  pTVar8 = analysis::TypeManager::GetRegisteredType
                     ((context->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,&local_80.super_Type);
  local_80.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_80.super_Type.decorations_);
  analysis::Vector::Vector(&local_80,pTVar8,2);
  if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(context);
  }
  pTVar8 = analysis::TypeManager::GetRegisteredType
                     ((context->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,&local_80.super_Type);
  uVar4 = analysis::TypeManager::GetTypeInstruction(this,pTVar8);
  uVar9 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar9 = (uint)inst->has_result_id_;
  }
  id = Instruction::GetSingleWordOperand(inst,uVar9 + 2);
  this_01 = analysis::DefUseManager::GetDef(this_00,id);
  uVar5 = 0;
  if (this_01->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(this_01,0);
  }
  pTVar8 = analysis::TypeManager::GetType(this,uVar5);
  iVar6 = (*pTVar8->_vptr_Type[9])(pTVar8);
  if (CONCAT44(extraout_var,iVar6) != 0) {
    uVar5 = 0;
    if (this_01->has_type_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(this_01,0);
    }
    pTVar8 = analysis::TypeManager::GetType(this,uVar5);
    iVar6 = (*pTVar8->_vptr_Type[9])(pTVar8);
    if (*(int *)(CONCAT44(extraout_var_00,iVar6) + 0x24) == 0x40) {
      local_f8.parent_ = IRContext::get_instr_block(context,inst);
      local_f8.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
      vec1 = 0;
      uVar5 = 0;
      local_f8.context_ = context;
      local_f8.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
      if (pIVar7->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      pIVar7 = InstructionBuilder::AddLoad(&local_f8,uVar5,uVar3,0);
      bVar1 = pIVar7->has_result_id_;
      if ((bool)bVar1 == true) {
        vec1 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
        bVar1 = pIVar7->has_result_id_;
      }
      uVar3 = 0;
      if ((bVar1 & 1) != 0) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      local_d8._0_8_ = operator_new(8);
      local_d8._8_8_ = local_d8._0_8_ + 8;
      *(uint *)(local_d8._0_8_ + 0) = 0;
      *(uint *)(local_d8._0_8_ + 4) = 1;
      local_c8 = (pointer)local_d8._8_8_;
      pIVar7 = InstructionBuilder::AddVectorShuffle
                         (&local_f8,uVar4,vec1,uVar3,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
      if ((pointer)local_d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_d8._0_8_,(long)local_c8 - local_d8._0_8_);
      }
      uVar4 = 0;
      uVar3 = 0;
      if (this_01->has_type_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(this_01,0);
      }
      if (pIVar7->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      pIVar7 = InstructionBuilder::AddUnaryOp(&local_f8,uVar3,OpBitcast,uVar4);
      uVar4 = 0;
      uVar3 = 0;
      if (this_01->has_type_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(this_01,0);
      }
      if (pIVar7->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      pIVar7 = InstructionBuilder::AddBinaryOp(&local_f8,uVar3,OpBitwiseAnd,uVar4,id);
      inst->opcode_ = OpBitCount;
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      if (pIVar7->has_result_id_ == true) {
        local_a8._16_4_ = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      local_a8._24_8_ = local_a8 + 0x10;
      local_a8._0_8_ = &PTR__SmallVector_003d7c78;
      local_88._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_a8._8_8_ = 1;
      local_d8._0_4_ = 1;
      local_d8._8_8_ = &PTR__SmallVector_003d7c78;
      local_c8 = (pointer)0x0;
      local_b8 = local_c0;
      local_b0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_a8);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 local_d8,local_a8);
      uVar9 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar9 = (uint)inst->has_result_id_;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&inst->operands_,
                 (Operand *)
                 ((long)((((inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -6) +
                 (ulong)(uVar9 * 0x30)),
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &inst->operands_,
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_48,uStack_40);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      local_d8._8_8_ = &PTR__SmallVector_003d7c78;
      if (local_b0 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_b0,local_b0);
      }
      local_b0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a8._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_88._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl !=
          (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_88,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_88._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      if ((context->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((context->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
      local_80.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_80.super_Type.decorations_);
      return true;
    }
    __assert_fail("type_mgr->GetType(mask_inst->type_id())->AsInteger()->width() == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1fc,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  __assert_fail("type_mgr->GetType(mask_inst->type_id())->AsInteger() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                ,0x1fb,
                "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

bool ReplaceMbcnt(IRContext* context, Instruction* inst,
                  const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = context->get_type_mgr();
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();

  uint32_t var_id =
      context->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::SubgroupLtMask));
  assert(var_id != 0 && "Could not get SubgroupLtMask variable.");
  context->AddCapability(spv::Capability::GroupNonUniformBallot);
  Instruction* var_inst = def_use_mgr->GetDef(var_id);
  Instruction* var_ptr_type = def_use_mgr->GetDef(var_inst->type_id());
  Instruction* var_type =
      def_use_mgr->GetDef(var_ptr_type->GetSingleWordInOperand(1));
  assert(var_type->opcode() == spv::Op::OpTypeVector &&
         "Variable is suppose to be a vector of 4 ints");

  // Get the type for the shuffle.
  analysis::Vector temp_type(GetUIntType(context), 2);
  const analysis::Type* shuffle_type =
      context->get_type_mgr()->GetRegisteredType(&temp_type);
  uint32_t shuffle_type_id = type_mgr->GetTypeInstruction(shuffle_type);

  uint32_t mask_id = inst->GetSingleWordInOperand(2);
  Instruction* mask_inst = def_use_mgr->GetDef(mask_id);

  // Testing with amd's shader compiler shows that a 64-bit mask is expected.
  assert(type_mgr->GetType(mask_inst->type_id())->AsInteger() != nullptr);
  assert(type_mgr->GetType(mask_inst->type_id())->AsInteger()->width() == 64);

  InstructionBuilder ir_builder(
      context, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* load = ir_builder.AddLoad(var_type->result_id(), var_id);
  Instruction* shuffle = ir_builder.AddVectorShuffle(
      shuffle_type_id, load->result_id(), load->result_id(), {0, 1});
  Instruction* bitcast = ir_builder.AddUnaryOp(
      mask_inst->type_id(), spv::Op::OpBitcast, shuffle->result_id());
  Instruction* t =
      ir_builder.AddBinaryOp(mask_inst->type_id(), spv::Op::OpBitwiseAnd,
                             bitcast->result_id(), mask_id);

  inst->SetOpcode(spv::Op::OpBitCount);
  inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {t->result_id()}}});
  context->UpdateDefUse(inst);
  return true;
}